

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.cpp
# Opt level: O2

size_t __thiscall solution::next_possible_step_ix(solution *this,size_t ix)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  
  while( true ) {
    sVar2 = std::deque<step,_std::allocator<step>_>::size(&this->possible_steps);
    if (sVar2 <= ix) {
      return ix;
    }
    this_00 = std::_Deque_iterator<step,_step_&,_step_*>::operator[]
                        (&(this->possible_steps).super__Deque_base<step,_std::allocator<step>_>.
                          _M_impl.super__Deque_impl_data._M_start,ix);
    bVar1 = step::can_apply(this_00);
    if (bVar1) break;
    ix = ix + 1;
  }
  return ix;
}

Assistant:

std::size_t solution::next_possible_step_ix(std::size_t ix)
{
	for (; ix < possible_steps.size(); ++ix) {
		if (possible_steps[ix].can_apply())
			break;
	}
	return ix;
}